

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NodeCompareLevelsDecrease(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *(uint *)(((ulong)*pp1 & 0xfffffffffffffffe) + 0x14) >> 0xc;
  uVar3 = *(uint *)(((ulong)*pp2 & 0xfffffffffffffffe) + 0x14) >> 0xc;
  if (uVar4 <= uVar3) {
    if ((int)(uVar4 - uVar3) < 0) {
      return 1;
    }
    iVar1 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 0x10);
    iVar2 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 0x10);
    if (iVar2 <= iVar1) {
      return (int)(iVar2 != iVar1);
    }
  }
  return -1;
}

Assistant:

int Abc_NodeCompareLevelsDecrease( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = Abc_ObjRegular(*pp1)->Level - Abc_ObjRegular(*pp2)->Level;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    Diff = Abc_ObjRegular(*pp1)->Id - Abc_ObjRegular(*pp2)->Id;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}